

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool HasMatchingArgumentNames
               (ArrayView<ArgumentData> *functionArguments,ArrayView<ArgumentData> arguments)

{
  SynIdentifier *pSVar1;
  bool bVar2;
  undefined1 local_58 [8];
  InplaceStr functionArgumentName;
  uint k;
  bool found;
  InplaceStr argumentName;
  uint e;
  uint i;
  ArrayView<ArgumentData> *functionArguments_local;
  ArrayView<ArgumentData> arguments_local;
  
  argumentName.end._0_4_ = arguments.count;
  argumentName.end._4_4_ = 0;
  do {
    if ((uint)argumentName.end <= argumentName.end._4_4_) {
      return true;
    }
    if (arguments.data[argumentName.end._4_4_].name != (SynIdentifier *)0x0) {
      pSVar1 = arguments.data[argumentName.end._4_4_].name;
      _k = (pSVar1->name).begin;
      argumentName.begin = (pSVar1->name).end;
      functionArgumentName.end._7_1_ = 0;
      for (functionArgumentName.end._0_4_ = 0;
          (uint)functionArgumentName.end < functionArguments->count;
          functionArgumentName.end._0_4_ = (uint)functionArgumentName.end + 1) {
        if (functionArguments->data[(uint)functionArgumentName.end].name != (SynIdentifier *)0x0) {
          pSVar1 = functionArguments->data[(uint)functionArgumentName.end].name;
          local_58 = (undefined1  [8])(pSVar1->name).begin;
          functionArgumentName.begin = (pSVar1->name).end;
          bVar2 = InplaceStr::operator==((InplaceStr *)local_58,(InplaceStr *)&k);
          if (bVar2) {
            functionArgumentName.end._7_1_ = 1;
            break;
          }
        }
      }
      if ((functionArgumentName.end._7_1_ & 1) == 0) {
        return false;
      }
    }
    argumentName.end._4_4_ = argumentName.end._4_4_ + 1;
  } while( true );
}

Assistant:

bool HasMatchingArgumentNames(ArrayView<ArgumentData> &functionArguments, ArrayView<ArgumentData> arguments)
{
	for(unsigned i = 0, e = arguments.count; i < e; i++)
	{
		if(!arguments.data[i].name)
			continue;

		InplaceStr argumentName = arguments.data[i].name->name;

		bool found = false;

		for(unsigned k = 0; k < functionArguments.count; k++)
		{
			if(!functionArguments.data[k].name)
				continue;

			InplaceStr functionArgumentName = functionArguments.data[k].name->name;

			if(functionArgumentName == argumentName)
			{
				found = true;
				break;
			}
		}

		if(!found)
			return false;
	}

	return true;
}